

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O3

void * pool_malloc(pool_t pool_id,int size)

{
  int iVar1;
  pool_info_t ppVar2;
  pool_node_t ppVar3;
  uint uVar4;
  undefined8 *elem;
  void *pvVar5;
  pool_node_t *pppVar6;
  ulong uVar7;
  uint uVar8;
  undefined6 in_register_0000003a;
  
  ppVar2 = pools[CONCAT62(in_register_0000003a,pool_id) & 0xffffffff];
  uVar8 = size + 7U & 0xfffffff8;
  uVar4 = prf_array_count(ppVar2->blocks);
  pppVar6 = ppVar2->blocks;
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      ppVar3 = pppVar6[uVar7];
      iVar1 = ppVar3->data_pos;
      if ((int)uVar8 <= ppVar3->data_size - iVar1) {
        ppVar3->data_pos = uVar8 + iVar1;
        return ppVar3->data + iVar1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  elem = (undefined8 *)malloc(0x10);
  uVar4 = ppVar2->block_size;
  if (ppVar2->block_size <= (int)uVar8) {
    uVar4 = uVar8;
  }
  *(uint *)(elem + 1) = uVar4;
  *(uint *)((long)elem + 0xc) = uVar8;
  pvVar5 = malloc((long)(int)uVar4);
  *elem = pvVar5;
  pppVar6 = (pool_node_t *)prf_array_append_ptr(pppVar6,elem);
  ppVar2->blocks = pppVar6;
  return (void *)*elem;
}

Assistant:

void *
pool_malloc(
    pool_t pool_id,
    int size )
{
    int i, num_blocks;
    pool_info_t pool;
    pool_node_t newnode;
    void * ptr;

    assert( (pool_id > 0) && (pool_id < prf_array_count( pools )) );
    assert( pools[ pool_id ] != NULL );

    pool = pools[ pool_id ];
    size = (size + 7) & (~7); /* we're always aligning on eight bytes */

    num_blocks = prf_array_count( pool->blocks );
    for ( i = 0; i < num_blocks; i++ ) {
        if ( size <= (pool->blocks[i]->data_size -
                      pool->blocks[i]->data_pos) ) {
            ptr = pool->blocks[i]->data + pool->blocks[i]->data_pos;
            pool->blocks[i]->data_pos += size;
            return ptr;
        }
    }
    /* need new block */

    newnode = (pool_node_t)malloc( sizeof( struct pool_node_s ) );
    assert( newnode != NULL );
    newnode->data_size = PRF_MAX( pool->block_size, size );
    newnode->data_pos = size;
    newnode->data = (uint8_t *)malloc( newnode->data_size );
    assert( newnode->data != NULL );
    pool->blocks = (pool_node_t *)prf_array_append_ptr(pool->blocks, newnode );
    return newnode->data;
}